

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_user_geometry.h
# Opt level: O2

PrimInfoMB * __thiscall
embree::sse2::UserGeometryISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,UserGeometryISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  PrimRefMB *pPVar1;
  Vec3fx *pVVar2;
  BBox1f BVar3;
  PrimRefMB *pPVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  LBBox3fx *pLVar10;
  undefined4 uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  size_t itime;
  unsigned_long uVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  uint uVar28;
  float fVar29;
  uint uVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float local_22c;
  float local_228;
  size_t local_1f0;
  ulong local_1e8;
  size_t local_1c0;
  unsigned_long local_1b8;
  BBox<embree::Vec3fa> bupper1;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  BBox1f local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  BBox3fa box;
  anon_class_16_2_4e716a3c local_b0;
  ulong local_a0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar15 = r->_begin;
  local_138.lower = 0.0;
  local_138.upper = 1.0;
  local_1b8 = 0;
  local_22c = 0.0;
  local_228 = 1.0;
  local_148._8_8_ = 0xff800000ff800000;
  local_148._0_8_ = 0xff800000ff800000;
  local_158._8_8_ = 0x7f8000007f800000;
  local_158._0_8_ = 0x7f8000007f800000;
  local_1e8 = 0;
  local_1c0 = 0;
  local_118._8_8_ = 0xff800000ff800000;
  local_118._0_8_ = 0xff800000ff800000;
  local_168._8_8_ = 0xff800000ff800000;
  local_168._0_8_ = 0xff800000ff800000;
  local_128._8_8_ = 0x7f8000007f800000;
  local_128._0_8_ = 0x7f8000007f800000;
  local_178._8_8_ = 0x7f8000007f800000;
  local_178._0_8_ = 0x7f8000007f800000;
  local_1f0 = k;
  do {
    if (r->_end <= uVar15) {
      (__return_storage_ptr__->object_range)._end = local_1b8;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        lower.field_0 = local_178._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.lower.field_0 + 8) = local_178._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        upper.field_0 = local_168._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.upper.field_0 + 8) = local_168._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        lower.field_0 = local_158._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.lower.field_0 + 8) = local_158._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        upper.field_0 = local_148._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.upper.field_0 + 8) = local_148._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
        field_0 = local_128._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               lower.field_0 + 8) = local_128._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
        field_0 = local_118._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               upper.field_0 + 8) = local_118._8_8_;
      (__return_storage_ptr__->time_range).lower = local_228;
      (__return_storage_ptr__->time_range).upper = local_22c;
      __return_storage_ptr__->num_time_segments = local_1c0;
      __return_storage_ptr__->max_num_time_segments = local_1e8;
      __return_storage_ptr__->max_time_range = local_138;
      return __return_storage_ptr__;
    }
    BVar3 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
    fVar24 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
    fVar18 = t0t1->upper;
    fVar22 = BVar3.lower;
    fVar27 = BVar3.upper - fVar22;
    fVar17 = floorf(((t0t1->lower - fVar22) / fVar27) * 1.0000002 * fVar24);
    fVar19 = 0.0;
    if (0.0 <= fVar17) {
      fVar19 = fVar17;
    }
    fVar18 = ceilf(((fVar18 - fVar22) / fVar27) * 0.99999976 * fVar24);
    if (fVar24 <= fVar18) {
      fVar18 = fVar24;
    }
    uVar13 = (ulong)(int)fVar19;
    while (fVar24 = (float)uVar15, uVar13 <= (ulong)(long)(int)fVar18) {
      bupper1.lower.field_0._0_8_ = (this->super_UserGeometry).super_AccelSet.super_Geometry.userPtr
      ;
      bupper1.lower.field_0.m128[3] = (float)(int)uVar13;
      bupper1.upper.field_0._0_8_ = &box;
      bupper1.lower.field_0.m128[2] = fVar24;
      uVar11 = (**(code **)&(this->super_UserGeometry).super_AccelSet.super_Geometry.field_0x58)
                         (&bupper1);
      auVar21._0_4_ =
           -(uint)((box.upper.field_0.m128[0] < 1.844e+18 && -1.844e+18 < box.lower.field_0.m128[0])
                  && box.lower.field_0.m128[0] <= box.upper.field_0.m128[0]);
      auVar21._4_4_ =
           -(uint)((box.upper.field_0.m128[1] < 1.844e+18 && -1.844e+18 < box.lower.field_0.m128[1])
                  && box.lower.field_0.m128[1] <= box.upper.field_0.m128[1]);
      auVar21._8_4_ =
           -(uint)((box.upper.field_0.m128[2] < 1.844e+18 && -1.844e+18 < box.lower.field_0.m128[2])
                  && box.lower.field_0.m128[2] <= box.upper.field_0.m128[2]);
      auVar21._12_4_ =
           -(uint)((box.upper.field_0.m128[3] < 1.844e+18 && -1.844e+18 < box.lower.field_0.m128[3])
                  && box.lower.field_0.m128[3] <= box.upper.field_0.m128[3]);
      uVar11 = movmskps(uVar11,auVar21);
      uVar13 = uVar13 + 1;
      if ((~(byte)uVar11 & 7) != 0) goto LAB_001b1539;
    }
    local_b0.primID = &local_a0;
    fVar18 = (this->super_UserGeometry).super_AccelSet.super_Geometry.fnumTimeSegments;
    fVar19 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range.lower;
    fVar22 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range.upper - fVar19;
    fVar27 = (t0t1->lower - fVar19) / fVar22;
    fVar22 = (t0t1->upper - fVar19) / fVar22;
    fVar31 = fVar18 * fVar22;
    local_b0.this = (AccelSet *)this;
    local_a0 = uVar15;
    fVar19 = floorf(fVar18 * fVar27);
    fVar17 = ceilf(fVar31);
    iVar12 = (int)fVar19;
    if (fVar19 <= 0.0) {
      fVar19 = 0.0;
    }
    fVar23 = fVar17;
    if (fVar18 <= fVar17) {
      fVar23 = fVar18;
    }
    iVar14 = -1;
    if (-1 < iVar12) {
      iVar14 = iVar12;
    }
    iVar9 = (int)fVar18 + 1;
    if ((int)fVar17 < (int)fVar18 + 1) {
      iVar9 = (int)fVar17;
    }
    AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()(&box,&local_b0,(long)(int)fVar19);
    AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
              (&bupper1,&local_b0,(long)(int)fVar23);
    fVar17 = fVar18 * fVar27 - fVar19;
    if (iVar9 - iVar14 == 1) {
      if (fVar17 <= 0.0) {
        fVar17 = 0.0;
      }
      fVar18 = 1.0 - fVar17;
      fVar37 = fVar18 * box.lower.field_0.m128[0] + fVar17 * bupper1.lower.field_0.m128[0];
      fVar38 = fVar18 * box.lower.field_0.m128[1] + fVar17 * bupper1.lower.field_0.m128[1];
      fVar39 = fVar18 * box.lower.field_0.m128[2] + fVar17 * bupper1.lower.field_0.m128[2];
      fVar19 = fVar18 * box.upper.field_0.m128[0] + fVar17 * bupper1.upper.field_0.m128[0];
      fVar35 = fVar18 * box.upper.field_0.m128[1] + fVar17 * bupper1.upper.field_0.m128[1];
      fVar36 = fVar18 * box.upper.field_0.m128[2] + fVar17 * bupper1.upper.field_0.m128[2];
      fVar23 = fVar23 - fVar31;
      if (fVar23 <= 0.0) {
        fVar23 = 0.0;
      }
      fVar18 = 1.0 - fVar23;
      fVar41 = bupper1.lower.field_0.m128[0] * fVar18 + box.lower.field_0.m128[0] * fVar23;
      fVar42 = bupper1.lower.field_0.m128[1] * fVar18 + box.lower.field_0.m128[1] * fVar23;
      fVar43 = bupper1.lower.field_0.m128[2] * fVar18 + box.lower.field_0.m128[2] * fVar23;
      fVar31 = fVar18 * bupper1.upper.field_0.m128[0] + fVar23 * box.upper.field_0.m128[0];
      fVar32 = fVar18 * bupper1.upper.field_0.m128[1] + fVar23 * box.upper.field_0.m128[1];
      fVar33 = fVar18 * bupper1.upper.field_0.m128[2] + fVar23 * box.upper.field_0.m128[2];
    }
    else {
      AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                (&blower1,&local_b0,(long)((int)fVar19 + 1));
      AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()
                (&bupper0,&local_b0,(long)((int)fVar23 + -1));
      if (fVar17 <= 0.0) {
        fVar17 = 0.0;
      }
      fVar34 = 1.0 - fVar17;
      fVar37 = box.lower.field_0.m128[0] * fVar34 + blower1.lower.field_0.m128[0] * fVar17;
      fVar38 = box.lower.field_0.m128[1] * fVar34 + blower1.lower.field_0.m128[1] * fVar17;
      fVar39 = box.lower.field_0.m128[2] * fVar34 + blower1.lower.field_0.m128[2] * fVar17;
      fVar40 = box.lower.field_0.m128[3] * fVar34 + blower1.lower.field_0.m128[3] * fVar17;
      fVar19 = fVar34 * box.upper.field_0.m128[0] + fVar17 * blower1.upper.field_0.m128[0];
      fVar35 = fVar34 * box.upper.field_0.m128[1] + fVar17 * blower1.upper.field_0.m128[1];
      fVar36 = fVar34 * box.upper.field_0.m128[2] + fVar17 * blower1.upper.field_0.m128[2];
      fVar17 = fVar34 * box.upper.field_0.m128[3] + fVar17 * blower1.upper.field_0.m128[3];
      fVar23 = fVar23 - fVar31;
      if (fVar23 <= 0.0) {
        fVar23 = 0.0;
      }
      fVar34 = 1.0 - fVar23;
      fVar41 = bupper1.lower.field_0.m128[0] * fVar34 + bupper0.lower.field_0.m128[0] * fVar23;
      fVar42 = bupper1.lower.field_0.m128[1] * fVar34 + bupper0.lower.field_0.m128[1] * fVar23;
      fVar43 = bupper1.lower.field_0.m128[2] * fVar34 + bupper0.lower.field_0.m128[2] * fVar23;
      fVar44 = bupper1.lower.field_0.m128[3] * fVar34 + bupper0.lower.field_0.m128[3] * fVar23;
      fVar31 = fVar34 * bupper1.upper.field_0.m128[0] + fVar23 * bupper0.upper.field_0.m128[0];
      fVar32 = fVar34 * bupper1.upper.field_0.m128[1] + fVar23 * bupper0.upper.field_0.m128[1];
      fVar33 = fVar34 * bupper1.upper.field_0.m128[2] + fVar23 * bupper0.upper.field_0.m128[2];
      fVar23 = fVar34 * bupper1.upper.field_0.m128[3] + fVar23 * bupper0.upper.field_0.m128[3];
      if (iVar12 < 0) {
        iVar12 = -1;
      }
      itime = (size_t)iVar12;
      while (itime = itime + 1, (long)itime < (long)iVar9) {
        fVar34 = ((float)(int)itime / fVar18 - fVar27) / (fVar22 - fVar27);
        fVar29 = 1.0 - fVar34;
        AccelSet::linearBounds::anon_class_16_2_4e716a3c::operator()(&bi,&local_b0,itime);
        auVar26._0_4_ = bi.lower.field_0.m128[0] - (fVar37 * fVar29 + fVar41 * fVar34);
        auVar26._4_4_ = bi.lower.field_0.m128[1] - (fVar38 * fVar29 + fVar42 * fVar34);
        auVar26._8_4_ = bi.lower.field_0.m128[2] - (fVar39 * fVar29 + fVar43 * fVar34);
        auVar26._12_4_ = bi.lower.field_0.m128[3] - (fVar40 * fVar29 + fVar44 * fVar34);
        auVar25._0_4_ = bi.upper.field_0.m128[0] - (fVar29 * fVar19 + fVar34 * fVar31);
        auVar25._4_4_ = bi.upper.field_0.m128[1] - (fVar29 * fVar35 + fVar34 * fVar32);
        auVar25._8_4_ = bi.upper.field_0.m128[2] - (fVar29 * fVar36 + fVar34 * fVar33);
        auVar25._12_4_ = bi.upper.field_0.m128[3] - (fVar29 * fVar17 + fVar34 * fVar23);
        auVar21 = minps(auVar26,ZEXT816(0));
        auVar26 = maxps(auVar25,ZEXT816(0));
        fVar37 = fVar37 + auVar21._0_4_;
        fVar38 = fVar38 + auVar21._4_4_;
        fVar39 = fVar39 + auVar21._8_4_;
        fVar40 = fVar40 + auVar21._12_4_;
        fVar41 = fVar41 + auVar21._0_4_;
        fVar42 = fVar42 + auVar21._4_4_;
        fVar43 = fVar43 + auVar21._8_4_;
        fVar44 = fVar44 + auVar21._12_4_;
        fVar19 = fVar19 + auVar26._0_4_;
        fVar35 = fVar35 + auVar26._4_4_;
        fVar36 = fVar36 + auVar26._8_4_;
        fVar17 = fVar17 + auVar26._12_4_;
        fVar31 = fVar31 + auVar26._0_4_;
        fVar32 = fVar32 + auVar26._4_4_;
        fVar33 = fVar33 + auVar26._8_4_;
        fVar23 = fVar23 + auVar26._12_4_;
      }
    }
    fVar18 = (float)((this->super_UserGeometry).super_AccelSet.super_Geometry.numTimeSteps - 1);
    uVar13 = (ulong)(uint)fVar18;
    auVar20._0_4_ = fVar19 * 0.5 + fVar31 * 0.5 + fVar37 * 0.5 + fVar41 * 0.5;
    auVar20._4_4_ = fVar35 * 0.5 + fVar32 * 0.5 + fVar38 * 0.5 + fVar42 * 0.5;
    auVar20._8_4_ = fVar36 * 0.5 + fVar33 * 0.5 + fVar39 * 0.5 + fVar43 * 0.5;
    auVar20._12_4_ = fVar24 * 0.5 + fVar18 * 0.5 + (float)geomID * 0.5 + fVar18 * 0.5;
    BVar3 = (this->super_UserGeometry).super_AccelSet.super_Geometry.time_range;
    auVar7._4_4_ = fVar38;
    auVar7._0_4_ = fVar37;
    auVar7._8_4_ = fVar39;
    auVar7._12_4_ = geomID;
    local_178 = minps(local_178,auVar7);
    local_1b8 = local_1b8 + 1;
    local_1c0 = local_1c0 + uVar13;
    bVar16 = local_1e8 < uVar13;
    if (local_1e8 <= uVar13) {
      local_1e8 = uVar13;
    }
    pPVar4 = prims->items;
    pPVar1 = pPVar4 + local_1f0;
    (pPVar1->lbounds).bounds0.lower.field_0.m128[0] = fVar37;
    (pPVar1->lbounds).bounds0.lower.field_0.m128[1] = fVar38;
    (pPVar1->lbounds).bounds0.lower.field_0.m128[2] = fVar39;
    (pPVar1->lbounds).bounds0.lower.field_0.m128[3] = (float)geomID;
    auVar6._4_4_ = fVar35;
    auVar6._0_4_ = fVar19;
    auVar6._8_4_ = fVar36;
    auVar6._12_4_ = fVar24;
    local_168 = maxps(local_168,auVar6);
    pVVar2 = &pPVar4[local_1f0].lbounds.bounds0.upper;
    (pVVar2->field_0).m128[0] = fVar19;
    (pVVar2->field_0).m128[1] = fVar35;
    (pVVar2->field_0).m128[2] = fVar36;
    (pVVar2->field_0).m128[3] = fVar24;
    auVar8._4_4_ = fVar42;
    auVar8._0_4_ = fVar41;
    auVar8._8_4_ = fVar43;
    auVar8._12_4_ = fVar18;
    local_158 = minps(local_158,auVar8);
    pLVar10 = &pPVar4[local_1f0].lbounds;
    (pLVar10->bounds1).lower.field_0.m128[0] = fVar41;
    (pLVar10->bounds1).lower.field_0.m128[1] = fVar42;
    (pLVar10->bounds1).lower.field_0.m128[2] = fVar43;
    (pLVar10->bounds1).lower.field_0.m128[3] = fVar18;
    auVar5._4_4_ = fVar32;
    auVar5._0_4_ = fVar31;
    auVar5._8_4_ = fVar33;
    auVar5._12_4_ = fVar18;
    local_148 = maxps(local_148,auVar5);
    pVVar2 = &pPVar4[local_1f0].lbounds.bounds1.upper;
    (pVVar2->field_0).m128[0] = fVar31;
    (pVVar2->field_0).m128[1] = fVar32;
    (pVVar2->field_0).m128[2] = fVar33;
    (pVVar2->field_0).m128[3] = fVar18;
    pPVar4[local_1f0].time_range = BVar3;
    local_128 = minps(local_128,auVar20);
    local_118 = maxps(local_118,auVar20);
    fVar24 = BVar3.lower;
    if (fVar24 <= local_228) {
      local_228 = fVar24;
    }
    fVar19 = BVar3.upper;
    fVar18 = fVar19;
    if (fVar19 <= local_22c) {
      fVar18 = local_22c;
    }
    uVar28 = (int)((uint)bVar16 << 0x1f) >> 0x1f;
    uVar30 = (int)((uint)bVar16 << 0x1f) >> 0x1f;
    local_1f0 = local_1f0 + 1;
    local_138.upper = (float)(~uVar30 & (uint)local_138.upper | (uint)fVar19 & uVar30);
    local_138.lower = (float)(~uVar28 & (uint)local_138.lower | (uint)fVar24 & uVar28);
    local_22c = fVar18;
LAB_001b1539:
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const PrimRefMB prim(linearBounds(j,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }